

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O0

void __thiscall SM83::jp_a16<(SM83::Conditions)3>(SM83 *this)

{
  bool bVar1;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_std::basic_string_view<char>,_const_unsigned_short_&>
  fmt;
  anon_union_2_2_fd64ea96_for_SM83_2 *args;
  string_view local_40;
  v11 *local_30;
  char *local_28;
  undefined1 local_1a [8];
  u16 addr;
  SM83 *this_local;
  
  unique0x100000fc = this;
  local_1a._0_2_ = GetWordFromPC(this);
  local_30 = (v11 *)0x15b63d;
  local_28 = (char *)0x4d;
  args = &this->field_1;
  local_40 = GetConditionString<(SM83::Conditions)3>(this);
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = local_28;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,std::basic_string_view<char,std::char_traits<char>>,unsigned_short_const&>
            (local_30,fmt,&args->bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,(unsigned_short *)&local_40,
             (basic_string_view<char,_std::char_traits<char>_> *)local_1a,&args->bc);
  bVar1 = MeetsCondition<(SM83::Conditions)3>(this);
  if (bVar1) {
    this->pc = local_1a._0_2_;
    Timer::AdvanceCycles(this->timer,4);
  }
  return;
}

Assistant:

void SM83::jp_a16() {
    const u16 addr = GetWordFromPC();

    if constexpr (cond == Conditions::None) {
        LTRACE("JP 0x{:04X}", addr);
    } else {
        LTRACE("JP {}, 0x{:04X}", GetConditionString<cond>(), addr);
    }

    if (MeetsCondition<cond>()) {
        pc = addr;
        timer.AdvanceCycles(4);
    }
}